

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

string * __thiscall
booster::log::sinks::format_plain_text_message_tz_abi_cxx11_
          (string *__return_storage_ptr__,sinks *this,message *msg,int tz_offset)

{
  long lVar1;
  time_put *ptVar2;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  ptime pVar8;
  ptime pVar9;
  undefined1 auStack_218 [8];
  locale local_210;
  long local_208;
  undefined1 local_200 [16];
  locale local_1f0;
  ostringstream ss;
  ios_base local_178 [96];
  locale alStack_118 [3];
  long alStack_100 [18];
  ptime local_70;
  tm formatted;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::locale::classic();
  std::ios::imbue(&local_1f0);
  std::locale::~locale(&local_1f0);
  pVar8 = ptime::now();
  iVar7 = (int)msg;
  pVar9 = ptime::from_number((double)iVar7);
  formatted._0_8_ = pVar9.sec + pVar8.sec;
  formatted.tm_hour = pVar9.nsec + pVar8.nsec;
  ptime::normalize((ptime *)&formatted);
  local_70.sec._0_4_ = formatted.tm_sec;
  local_70.sec._4_4_ = formatted.tm_min;
  local_70.nsec = formatted.tm_hour;
  ptime::universal_time(&formatted,&local_70);
  std::locale::locale(&local_210,(locale *)((long)&alStack_118[0]._M_impl + *(long *)(_ss + -0x18)))
  ;
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_210);
  lVar1 = *(long *)((long)alStack_100 + *(long *)(_ss + -0x18));
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar2,lVar1,lVar1 == 0,&ss + *(long *)(_ss + -0x18),0x20,&formatted,
             "%Y-%m-%d %H:%M:%S","");
  std::locale::~locale(&local_210);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," GMT",4);
  if (iVar7 != 0) {
    local_210._M_impl._0_1_ = (iVar7 < 1) * '\x02' + '+';
    uVar6 = (ulong)(uint)-iVar7;
    if (0 < iVar7) {
      uVar6 = (ulong)msg & 0xffffffff;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,(char *)&local_210,1)
    ;
    std::ostream::operator<<((ostream *)poVar3,(int)(uVar6 / 0xe10));
    iVar7 = (int)(uVar6 / 0x3c) + (int)(uVar6 / 0xe10) * -0x3c;
    if (iVar7 != 0) {
      local_210._M_impl._0_1_ = ':';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&ss,(char *)&local_210,1);
      std::ostream::operator<<((ostream *)poVar3,iVar7);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,";",1);
  pcVar5 = *(char **)(this + 8);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(_ss + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar5,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
  pcVar5 = logger::level_to_string(*(level_type *)this);
  sVar4 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar5,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,": ",2);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ss,(char *)CONCAT71(local_210._M_impl._1_7_,(char)local_210._M_impl),
             local_208);
  if ((undefined1 *)CONCAT71(local_210._M_impl._1_7_,(char)local_210._M_impl) != local_200) {
    operator_delete((undefined1 *)CONCAT71(local_210._M_impl._1_7_,(char)local_210._M_impl));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," (",2);
  pcVar5 = *(char **)(this + 0x10);
  sVar4 = strlen(pcVar5);
  while ((0x2e < (byte)pcVar5[sVar4] - 0x2f ||
         ((0x600000000801U >> ((ulong)((byte)pcVar5[sVar4] - 0x2f) & 0x3f) & 1) == 0))) {
    if (sVar4 == 0) {
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(_ss + -0x18) + 0x30);
      }
      else {
LAB_001694ac:
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&ss,*(int *)(this + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      std::ios_base::~ios_base(local_178);
      return __return_storage_ptr__;
    }
    sVar4 = sVar4 - 1;
  }
  pcVar5 = pcVar5 + sVar4 + 1;
  goto LAB_001694ac;
}

Assistant:

std::string format_plain_text_message_tz(message const &msg,int tz_offset)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now() + ptime::from_number(tz_offset);
			std::tm formatted = ptime::universal_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << " GMT";
			if(tz_offset != 0) {
				char sign = tz_offset > 0 ? '+' : '-';
				if(tz_offset < 0)
					tz_offset = -tz_offset;
				int hours = tz_offset  / 3600;
				int minutes = tz_offset / 60 % 60;
				ss << sign << hours;
				if(minutes!=0)
					ss << ':' << minutes;
			}
			ss << ";";
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}